

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,3ul>,int>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,array<int,_3UL> *v,
               ItemNamer *vnam)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'[');
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    if ((int)lVar2 != 0) {
      value.size_ = 2;
      value.data_ = ", ";
      fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
    }
    __s = ItemNamer::at(vnam,(long)*(int *)((long)v->_M_elems + lVar2));
    sVar1 = strlen(__s);
    value_00.size_ = sVar1;
    value_00.data_ = __s;
    fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_00);
  }
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,']');
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt, const Vec& v,
    ItemNamer& vnam) {
  static_assert (
  std::is_integral_v<typename Vec::value_type>, "Variable vector: need int's");
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << vnam.at(el);
  }
  wrt << ']';
}